

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void store_pool_init(png_store *ps,store_pool *pool)

{
  (ps->exception_context).penv = (jmp_buf *)&pm;
  *(undefined8 *)&(ps->exception_context).caught = 0;
  (ps->exception_context).v.etmp = (png_store *)0x0;
  *(undefined8 *)&ps->field_0x18 = 0;
  ps->nwarnings = 0;
  ps->noptions = 0;
  ps->options[0].option = '\0';
  ps->options[0].setting = '\0';
  ps->options[1].option = '\0';
  ps->options[1].setting = '\0';
  ps->options[2].option = '\0';
  ps->options[2].setting = '\0';
  ps->options[3].option = '\0';
  ps->options[3].setting = '\0';
  ps->options[4].option = '\0';
  ps->options[4].setting = '\0';
  ps->options[5].option = '\0';
  ps->options[5].setting = '\0';
  ps->options[6].option = '\0';
  ps->options[6].setting = '\0';
  ps->options[7].option = '\0';
  ps->options[7].setting = '\0';
  ps->options[8].option = '\0';
  ps->options[8].setting = '\0';
  ps->options[9].option = '\0';
  ps->options[9].setting = '\0';
  ps->options[10].option = '\0';
  ps->options[10].setting = '\0';
  ps->options[0xb].option = '\0';
  ps->options[0xb].setting = '\0';
  ps->options[0xc].option = '\0';
  ps->options[0xc].setting = '\0';
  ps->options[0xd].option = '\0';
  ps->options[0xd].setting = '\0';
  ps->options[0xe].option = '\0';
  ps->options[0xe].setting = '\0';
  ps->options[0xf].option = '\0';
  ps->options[0xf].setting = '\0';
  ps->test[0] = '\0';
  ps->test[1] = '\0';
  ps->test[2] = '\0';
  ps->test[3] = '\0';
  ps->test[4] = '\0';
  ps->test[5] = '\0';
  ps->test[6] = '\0';
  ps->test[7] = '\0';
  store_pool_mark((png_bytep)&(ps->exception_context).v);
  return;
}

Assistant:

static void
store_pool_init(png_store *ps, store_pool *pool)
{
   memset(pool, 0, sizeof *pool);

   pool->store = ps;
   pool->list = NULL;
   pool->max = pool->current = pool->limit = pool->total = 0;
   pool->max_max = pool->max_limit = pool->max_total = 0;
   store_pool_mark(pool->mark);
}